

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O3

void TestAddBignum(void)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Vector<const_char> value;
  Vector<const_char> value_00;
  Vector<const_char> value_01;
  Vector<const_char> value_02;
  Vector<const_char> value_03;
  Vector<const_char> value_04;
  Vector<const_char> value_05;
  Vector<const_char> value_06;
  Vector<const_char> value_07;
  Vector<const_char> value_08;
  Vector<const_char> value_09;
  Vector<const_char> value_10;
  Vector<const_char> value_11;
  Vector<const_char> value_12;
  char buffer [1024];
  Bignum other;
  Bignum bignum;
  char local_828;
  char cStack_827;
  char cStack_826;
  char cStack_825;
  char cStack_824;
  char cStack_823;
  char cStack_822;
  char cStack_821;
  char cStack_820;
  char cStack_81f;
  char cStack_81e;
  char cStack_81d;
  char cStack_81c;
  char cStack_81b;
  char cStack_81a;
  char cStack_819;
  char cStack_818;
  char cStack_817;
  char cStack_816;
  char cStack_815;
  char cStack_814;
  char cStack_813;
  char cStack_812;
  char cStack_811;
  char cStack_810;
  char cStack_80f;
  char cStack_80e;
  char cStack_80d;
  char cStack_80c;
  char cStack_80b;
  Bignum local_420;
  Bignum local_21c;
  
  local_21c.used_bigits_ = 0;
  local_21c.exponent_ = 0;
  local_420.used_bigits_ = 0;
  local_420.exponent_ = 0;
  value._8_8_ = 1;
  value.start_ = "1";
  double_conversion::Bignum::AssignHexString(&local_420,value);
  value_00._8_8_ = 1;
  value_00.start_ = "0";
  double_conversion::Bignum::AssignHexString(&local_21c,value_00);
  double_conversion::Bignum::AddBignum(&local_21c,&local_420);
  bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
  if (!bVar1) {
    pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
    uVar4 = 0x109;
LAB_0081fa22:
    printf("%s:%d:\n CHECK(%s) failed\n",
           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
           ,uVar4,pcVar3);
    abort();
  }
  if (CONCAT11(cStack_827,local_828) == 0x31) {
    value_01._8_8_ = 1;
    value_01.start_ = "1";
    double_conversion::Bignum::AssignHexString(&local_21c,value_01);
    double_conversion::Bignum::AddBignum(&local_21c,&local_420);
    bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
    if (!bVar1) {
      pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
      uVar4 = 0x10e;
      goto LAB_0081fa22;
    }
    if (CONCAT11(cStack_827,local_828) == 0x32) {
      value_02._8_8_ = 7;
      value_02.start_ = "FFFFFFF";
      double_conversion::Bignum::AssignHexString(&local_21c,value_02);
      double_conversion::Bignum::AddBignum(&local_21c,&local_420);
      bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
      if (!bVar1) {
        pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
        uVar4 = 0x113;
        goto LAB_0081fa22;
      }
      if (cStack_820 == '\0' &&
          CONCAT17(cStack_821,
                   CONCAT16(cStack_822,
                            CONCAT15(cStack_823,
                                     CONCAT14(cStack_824,
                                              CONCAT13(cStack_825,
                                                       CONCAT12(cStack_826,
                                                                CONCAT11(cStack_827,local_828)))))))
          == 0x3030303030303031) {
        value_03._8_8_ = 0xe;
        value_03.start_ = "FFFFFFFFFFFFFF";
        double_conversion::Bignum::AssignHexString(&local_21c,value_03);
        double_conversion::Bignum::AddBignum(&local_21c,&local_420);
        bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
        if (!bVar1) {
          pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
          uVar4 = 0x118;
          goto LAB_0081fa22;
        }
        auVar6[0] = -(local_828 == '1');
        auVar6[1] = -(cStack_827 == '0');
        auVar6[2] = -(cStack_826 == '0');
        auVar6[3] = -(cStack_825 == '0');
        auVar6[4] = -(cStack_824 == '0');
        auVar6[5] = -(cStack_823 == '0');
        auVar6[6] = -(cStack_822 == '0');
        auVar6[7] = -(cStack_821 == '0');
        auVar6[8] = -(cStack_820 == '0');
        auVar6[9] = -(cStack_81f == '0');
        auVar6[10] = -(cStack_81e == '0');
        auVar6[0xb] = -(cStack_81d == '0');
        auVar6[0xc] = -(cStack_81c == '0');
        auVar6[0xd] = -(cStack_81b == '0');
        auVar6[0xe] = -(cStack_81a == '0');
        auVar6[0xf] = -(cStack_819 == '\0');
        if ((ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar6[0xf] >> 7) << 0xf) == 0xffff) {
          value_04._8_8_ = 0x2c;
          value_04.start_ = "10000000000000000000000000000000000000000000";
          double_conversion::Bignum::AssignHexString(&local_21c,value_04);
          double_conversion::Bignum::AddBignum(&local_21c,&local_420);
          bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
          if (!bVar1) {
            pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
            uVar4 = 0x11d;
            goto LAB_0081fa22;
          }
          iVar2 = bcmp("10000000000000000000000000000000000000000001",&local_828,0x2d);
          if (iVar2 == 0) {
            value_05._8_8_ = 0xd;
            value_05.start_ = "1000000000000";
            double_conversion::Bignum::AssignHexString(&local_420,value_05);
            value_06._8_8_ = 1;
            value_06.start_ = "1";
            double_conversion::Bignum::AssignHexString(&local_21c,value_06);
            double_conversion::Bignum::AddBignum(&local_21c,&local_420);
            bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
            if (!bVar1) {
              pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
              uVar4 = 0x124;
              goto LAB_0081fa22;
            }
            if (CONCAT17(cStack_81b,
                         CONCAT16(cStack_81c,
                                  CONCAT15(cStack_81d,
                                           CONCAT14(cStack_81e,
                                                    CONCAT13(cStack_81f,
                                                             CONCAT12(cStack_820,
                                                                      CONCAT11(cStack_821,cStack_822
                                                                              ))))))) ==
                0x31303030303030 &&
                CONCAT17(cStack_821,
                         CONCAT16(cStack_822,
                                  CONCAT15(cStack_823,
                                           CONCAT14(cStack_824,
                                                    CONCAT13(cStack_825,
                                                             CONCAT12(cStack_826,
                                                                      CONCAT11(cStack_827,local_828)
                                                                     )))))) == 0x3030303030303031) {
              value_07._8_8_ = 7;
              value_07.start_ = "FFFFFFF";
              double_conversion::Bignum::AssignHexString(&local_21c,value_07);
              double_conversion::Bignum::AddBignum(&local_21c,&local_420);
              bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
              if (!bVar1) {
                pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                uVar4 = 0x129;
                goto LAB_0081fa22;
              }
              if (CONCAT17(cStack_81b,
                           CONCAT16(cStack_81c,
                                    CONCAT15(cStack_81d,
                                             CONCAT14(cStack_81e,
                                                      CONCAT13(cStack_81f,
                                                               CONCAT12(cStack_820,
                                                                        CONCAT11(cStack_821,
                                                                                 cStack_822)))))))
                  == 0x46464646464646 &&
                  CONCAT17(cStack_821,
                           CONCAT16(cStack_822,
                                    CONCAT15(cStack_823,
                                             CONCAT14(cStack_824,
                                                      CONCAT13(cStack_825,
                                                               CONCAT12(cStack_826,
                                                                        CONCAT11(cStack_827,
                                                                                 local_828))))))) ==
                  0x4646303030303031) {
                value_08._8_8_ = 0x2c;
                value_08.start_ = "10000000000000000000000000000000000000000000";
                double_conversion::Bignum::AssignHexString(&local_21c,value_08);
                double_conversion::Bignum::AddBignum(&local_21c,&local_420);
                bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
                if (!bVar1) {
                  pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                  uVar4 = 0x12e;
                  goto LAB_0081fa22;
                }
                iVar2 = bcmp("10000000000000000000000000000001000000000000",&local_828,0x2d);
                if (iVar2 == 0) {
                  value_09._8_8_ = 0x2a;
                  value_09.start_ = "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF";
                  double_conversion::Bignum::AssignHexString(&local_21c,value_09);
                  double_conversion::Bignum::AddBignum(&local_21c,&local_420);
                  bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
                  if (!bVar1) {
                    pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                    uVar4 = 0x133;
                    goto LAB_0081fa22;
                  }
                  iVar2 = bcmp("1000000000000000000000000000000FFFFFFFFFFFF",&local_828,0x2c);
                  if (iVar2 == 0) {
                    double_conversion::Bignum::AssignUInt16(&local_21c,1);
                    double_conversion::Bignum::ShiftLeft(&local_21c,100);
                    double_conversion::Bignum::AddBignum(&local_21c,&local_420);
                    bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
                    if (!bVar1) {
                      pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                      uVar4 = 0x139;
                      goto LAB_0081fa22;
                    }
                    auVar12[0] = -(cStack_81d == '0');
                    auVar12[1] = -(cStack_81c == '0');
                    auVar12[2] = -(cStack_81b == '1');
                    auVar12[3] = -(cStack_81a == '0');
                    auVar12[4] = -(cStack_819 == '0');
                    auVar12[5] = -(cStack_818 == '0');
                    auVar12[6] = -(cStack_817 == '0');
                    auVar12[7] = -(cStack_816 == '0');
                    auVar12[8] = -(cStack_815 == '0');
                    auVar12[9] = -(cStack_814 == '0');
                    auVar12[10] = -(cStack_813 == '0');
                    auVar12[0xb] = -(cStack_812 == '0');
                    auVar12[0xc] = -(cStack_811 == '0');
                    auVar12[0xd] = -(cStack_810 == '0');
                    auVar12[0xe] = -(cStack_80f == '0');
                    auVar12[0xf] = -(cStack_80e == '\0');
                    auVar7[0] = -(local_828 == '1');
                    auVar7[1] = -(cStack_827 == '0');
                    auVar7[2] = -(cStack_826 == '0');
                    auVar7[3] = -(cStack_825 == '0');
                    auVar7[4] = -(cStack_824 == '0');
                    auVar7[5] = -(cStack_823 == '0');
                    auVar7[6] = -(cStack_822 == '0');
                    auVar7[7] = -(cStack_821 == '0');
                    auVar7[8] = -(cStack_820 == '0');
                    auVar7[9] = -(cStack_81f == '0');
                    auVar7[10] = -(cStack_81e == '0');
                    auVar7[0xb] = -(cStack_81d == '0');
                    auVar7[0xc] = -(cStack_81c == '0');
                    auVar7[0xd] = -(cStack_81b == '1');
                    auVar7[0xe] = -(cStack_81a == '0');
                    auVar7[0xf] = -(cStack_819 == '0');
                    auVar7 = auVar7 & auVar12;
                    if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                                (ushort)(byte)(auVar7[0xf] >> 7) << 0xf) == 0xffff) {
                      double_conversion::Bignum::ShiftLeft(&local_420,0x40);
                      bVar1 = double_conversion::Bignum::ToHexString(&local_420,&local_828,0x400);
                      if (!bVar1) {
                        pcVar3 = "other.ToHexString(buffer, kBufferSize)";
                        uVar4 = 0x13d;
                        goto LAB_0081fa22;
                      }
                      auVar13[0] = -(cStack_81a == '0');
                      auVar13[1] = -(cStack_819 == '0');
                      auVar13[2] = -(cStack_818 == '0');
                      auVar13[3] = -(cStack_817 == '0');
                      auVar13[4] = -(cStack_816 == '0');
                      auVar13[5] = -(cStack_815 == '0');
                      auVar13[6] = -(cStack_814 == '0');
                      auVar13[7] = -(cStack_813 == '0');
                      auVar13[8] = -(cStack_812 == '0');
                      auVar13[9] = -(cStack_811 == '0');
                      auVar13[10] = -(cStack_810 == '0');
                      auVar13[0xb] = -(cStack_80f == '0');
                      auVar13[0xc] = -(cStack_80e == '0');
                      auVar13[0xd] = -(cStack_80d == '0');
                      auVar13[0xe] = -(cStack_80c == '0');
                      auVar13[0xf] = -(cStack_80b == '\0');
                      auVar8[0] = -(local_828 == '1');
                      auVar8[1] = -(cStack_827 == '0');
                      auVar8[2] = -(cStack_826 == '0');
                      auVar8[3] = -(cStack_825 == '0');
                      auVar8[4] = -(cStack_824 == '0');
                      auVar8[5] = -(cStack_823 == '0');
                      auVar8[6] = -(cStack_822 == '0');
                      auVar8[7] = -(cStack_821 == '0');
                      auVar8[8] = -(cStack_820 == '0');
                      auVar8[9] = -(cStack_81f == '0');
                      auVar8[10] = -(cStack_81e == '0');
                      auVar8[0xb] = -(cStack_81d == '0');
                      auVar8[0xc] = -(cStack_81c == '0');
                      auVar8[0xd] = -(cStack_81b == '0');
                      auVar8[0xe] = -(cStack_81a == '0');
                      auVar8[0xf] = -(cStack_819 == '0');
                      auVar8 = auVar8 & auVar13;
                      if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                                   (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                                   (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                                   (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                                   (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                                   (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                                   (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                                   (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                                   (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                                   (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                                   (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                                   (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                                   (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                                   (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                                  (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
                        double_conversion::Bignum::AssignUInt16(&local_21c,1);
                        bVar1 = double_conversion::Bignum::ToHexString(&local_21c,&local_828,0x400);
                        if (!bVar1) {
                          pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                          uVar4 = 0x141;
                          goto LAB_0081fa22;
                        }
                        if (CONCAT11(cStack_827,local_828) == 0x31) {
                          double_conversion::Bignum::AddBignum(&local_21c,&local_420);
                          bVar1 = double_conversion::Bignum::ToHexString
                                            (&local_21c,&local_828,0x400);
                          if (!bVar1) {
                            pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                            uVar4 = 0x145;
                            goto LAB_0081fa22;
                          }
                          auVar9[0] = -(cStack_81a == '0');
                          auVar9[1] = -(cStack_819 == '0');
                          auVar9[2] = -(cStack_818 == '0');
                          auVar9[3] = -(cStack_817 == '0');
                          auVar9[4] = -(cStack_816 == '0');
                          auVar9[5] = -(cStack_815 == '0');
                          auVar9[6] = -(cStack_814 == '0');
                          auVar9[7] = -(cStack_813 == '0');
                          auVar9[8] = -(cStack_812 == '0');
                          auVar9[9] = -(cStack_811 == '0');
                          auVar9[10] = -(cStack_810 == '0');
                          auVar9[0xb] = -(cStack_80f == '0');
                          auVar9[0xc] = -(cStack_80e == '0');
                          auVar9[0xd] = -(cStack_80d == '0');
                          auVar9[0xe] = -(cStack_80c == '1');
                          auVar9[0xf] = -(cStack_80b == '\0');
                          auVar14[0] = -(local_828 == '1');
                          auVar14[1] = -(cStack_827 == '0');
                          auVar14[2] = -(cStack_826 == '0');
                          auVar14[3] = -(cStack_825 == '0');
                          auVar14[4] = -(cStack_824 == '0');
                          auVar14[5] = -(cStack_823 == '0');
                          auVar14[6] = -(cStack_822 == '0');
                          auVar14[7] = -(cStack_821 == '0');
                          auVar14[8] = -(cStack_820 == '0');
                          auVar14[9] = -(cStack_81f == '0');
                          auVar14[10] = -(cStack_81e == '0');
                          auVar14[0xb] = -(cStack_81d == '0');
                          auVar14[0xc] = -(cStack_81c == '0');
                          auVar14[0xd] = -(cStack_81b == '0');
                          auVar14[0xe] = -(cStack_81a == '0');
                          auVar14[0xf] = -(cStack_819 == '0');
                          auVar9 = auVar9 & auVar14;
                          if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) |
                                       (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                                       (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                                       (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                                       (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                                       (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                                       (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                                       (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                                       (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                                       (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                                       (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                                       (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                                       (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                                       (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe |
                                      (ushort)(byte)(auVar9[0xf] >> 7) << 0xf) == 0xffff) {
                            value_10._8_8_ = 7;
                            value_10.start_ = "FFFFFFF";
                            double_conversion::Bignum::AssignHexString(&local_21c,value_10);
                            double_conversion::Bignum::AddBignum(&local_21c,&local_420);
                            bVar1 = double_conversion::Bignum::ToHexString
                                              (&local_21c,&local_828,0x400);
                            if (!bVar1) {
                              pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                              uVar4 = 0x14a;
                              goto LAB_0081fa22;
                            }
                            auVar15[0] = -(local_828 == '1');
                            auVar15[1] = -(cStack_827 == '0');
                            auVar15[2] = -(cStack_826 == '0');
                            auVar15[3] = -(cStack_825 == '0');
                            auVar15[4] = -(cStack_824 == '0');
                            auVar15[5] = -(cStack_823 == '0');
                            auVar15[6] = -(cStack_822 == '0');
                            auVar15[7] = -(cStack_821 == '0');
                            auVar15[8] = -(cStack_820 == '0');
                            auVar15[9] = -(cStack_81f == '0');
                            auVar15[10] = -(cStack_81e == '0');
                            auVar15[0xb] = -(cStack_81d == '0');
                            auVar15[0xc] = -(cStack_81c == '0');
                            auVar15[0xd] = -(cStack_81b == '0');
                            auVar15[0xe] = -(cStack_81a == '0');
                            auVar15[0xf] = -(cStack_819 == '0');
                            auVar10[0] = -(cStack_81a == '0');
                            auVar10[1] = -(cStack_819 == '0');
                            auVar10[2] = -(cStack_818 == '0');
                            auVar10[3] = -(cStack_817 == '0');
                            auVar10[4] = -(cStack_816 == '0');
                            auVar10[5] = -(cStack_815 == '0');
                            auVar10[6] = -(cStack_814 == '0');
                            auVar10[7] = -(cStack_813 == '0');
                            auVar10[8] = -(cStack_812 == 'F');
                            auVar10[9] = -(cStack_811 == 'F');
                            auVar10[10] = -(cStack_810 == 'F');
                            auVar10[0xb] = -(cStack_80f == 'F');
                            auVar10[0xc] = -(cStack_80e == 'F');
                            auVar10[0xd] = -(cStack_80d == 'F');
                            auVar10[0xe] = -(cStack_80c == 'F');
                            auVar10[0xf] = -(cStack_80b == '\0');
                            auVar10 = auVar10 & auVar15;
                            if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                         (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                         (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                         (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                         (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                         (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                         (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                         (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                         (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                         (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                         (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                         (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                         (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                         (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                         (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                        (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
                              value_11._8_8_ = 0x2c;
                              value_11.start_ = "10000000000000000000000000000000000000000000";
                              double_conversion::Bignum::AssignHexString(&local_21c,value_11);
                              double_conversion::Bignum::AddBignum(&local_21c,&local_420);
                              bVar1 = double_conversion::Bignum::ToHexString
                                                (&local_21c,&local_828,0x400);
                              if (!bVar1) {
                                pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                                uVar4 = 0x14f;
                                goto LAB_0081fa22;
                              }
                              iVar2 = bcmp("10000000000000010000000000000000000000000000",&local_828
                                           ,0x2d);
                              if (iVar2 == 0) {
                                value_12._8_8_ = 0x2a;
                                value_12.start_ = "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF";
                                double_conversion::Bignum::AssignHexString(&local_21c,value_12);
                                double_conversion::Bignum::AddBignum(&local_21c,&local_420);
                                bVar1 = double_conversion::Bignum::ToHexString
                                                  (&local_21c,&local_828,0x400);
                                if (!bVar1) {
                                  pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                                  uVar4 = 0x154;
                                  goto LAB_0081fa22;
                                }
                                iVar2 = bcmp("100000000000000FFFFFFFFFFFFFFFFFFFFFFFFFFFF",
                                             &local_828,0x2c);
                                if (iVar2 == 0) {
                                  double_conversion::Bignum::AssignUInt16(&local_21c,1);
                                  double_conversion::Bignum::ShiftLeft(&local_21c,100);
                                  double_conversion::Bignum::AddBignum(&local_21c,&local_420);
                                  bVar1 = double_conversion::Bignum::ToHexString
                                                    (&local_21c,&local_828,0x400);
                                  if (!bVar1) {
                                    pcVar3 = "bignum.ToHexString(buffer, kBufferSize)";
                                    uVar4 = 0x15a;
                                    goto LAB_0081fa22;
                                  }
                                  auVar11[0] = -(local_828 == '1');
                                  auVar11[1] = -(cStack_827 == '0');
                                  auVar11[2] = -(cStack_826 == '0');
                                  auVar11[3] = -(cStack_825 == '1');
                                  auVar11[4] = -(cStack_824 == '0');
                                  auVar11[5] = -(cStack_823 == '0');
                                  auVar11[6] = -(cStack_822 == '0');
                                  auVar11[7] = -(cStack_821 == '0');
                                  auVar11[8] = -(cStack_820 == '0');
                                  auVar11[9] = -(cStack_81f == '0');
                                  auVar11[10] = -(cStack_81e == '0');
                                  auVar11[0xb] = -(cStack_81d == '0');
                                  auVar11[0xc] = -(cStack_81c == '0');
                                  auVar11[0xd] = -(cStack_81b == '0');
                                  auVar11[0xe] = -(cStack_81a == '0');
                                  auVar11[0xf] = -(cStack_819 == '0');
                                  auVar16[0] = -(cStack_81a == '0');
                                  auVar16[1] = -(cStack_819 == '0');
                                  auVar16[2] = -(cStack_818 == '0');
                                  auVar16[3] = -(cStack_817 == '0');
                                  auVar16[4] = -(cStack_816 == '0');
                                  auVar16[5] = -(cStack_815 == '0');
                                  auVar16[6] = -(cStack_814 == '0');
                                  auVar16[7] = -(cStack_813 == '0');
                                  auVar16[8] = -(cStack_812 == '0');
                                  auVar16[9] = -(cStack_811 == '0');
                                  auVar16[10] = -(cStack_810 == '0');
                                  auVar16[0xb] = -(cStack_80f == '0');
                                  auVar16[0xc] = -(cStack_80e == '0');
                                  auVar16[0xd] = -(cStack_80d == '0');
                                  auVar16[0xe] = -(cStack_80c == '0');
                                  auVar16[0xf] = -(cStack_80b == '\0');
                                  auVar11 = auVar11 & auVar16;
                                  if ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                                               (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                                               (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                                               (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                                               (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                                               (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                                               (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                                               (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                                               (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                                               (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                                               (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                                               (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                                               (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                                               (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                                              (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff) {
                                    return;
                                  }
                                  pcVar3 = "\"10010000000000000000000000000\"";
                                  pcVar5 = "10010000000000000000000000000";
                                  uVar4 = 0x15b;
                                }
                                else {
                                  pcVar3 = "\"100000000000000FFFFFFFFFFFFFFFFFFFFFFFFFFFF\"";
                                  pcVar5 = "100000000000000FFFFFFFFFFFFFFFFFFFFFFFFFFFF";
                                  uVar4 = 0x155;
                                }
                              }
                              else {
                                pcVar3 = "\"10000000000000010000000000000000000000000000\"";
                                pcVar5 = "10000000000000010000000000000000000000000000";
                                uVar4 = 0x150;
                              }
                            }
                            else {
                              pcVar3 = "\"1000000000000000000000FFFFFFF\"";
                              pcVar5 = "1000000000000000000000FFFFFFF";
                              uVar4 = 0x14b;
                            }
                          }
                          else {
                            pcVar3 = "\"10000000000000000000000000001\"";
                            pcVar5 = "10000000000000000000000000001";
                            uVar4 = 0x146;
                          }
                        }
                        else {
                          pcVar3 = "\"1\"";
                          pcVar5 = "1";
                          uVar4 = 0x142;
                        }
                      }
                      else {
                        pcVar3 = "\"10000000000000000000000000000\"";
                        pcVar5 = "10000000000000000000000000000";
                        uVar4 = 0x13e;
                      }
                    }
                    else {
                      pcVar3 = "\"10000000000001000000000000\"";
                      pcVar5 = "10000000000001000000000000";
                      uVar4 = 0x13a;
                    }
                  }
                  else {
                    pcVar3 = "\"1000000000000000000000000000000FFFFFFFFFFFF\"";
                    pcVar5 = "1000000000000000000000000000000FFFFFFFFFFFF";
                    uVar4 = 0x134;
                  }
                }
                else {
                  pcVar3 = "\"10000000000000000000000000000001000000000000\"";
                  pcVar5 = "10000000000000000000000000000001000000000000";
                  uVar4 = 0x12f;
                }
              }
              else {
                pcVar3 = "\"100000FFFFFFF\"";
                pcVar5 = "100000FFFFFFF";
                uVar4 = 0x12a;
              }
            }
            else {
              pcVar3 = "\"1000000000001\"";
              pcVar5 = "1000000000001";
              uVar4 = 0x125;
            }
          }
          else {
            pcVar3 = "\"10000000000000000000000000000000000000000001\"";
            pcVar5 = "10000000000000000000000000000000000000000001";
            uVar4 = 0x11e;
          }
        }
        else {
          pcVar3 = "\"100000000000000\"";
          pcVar5 = "100000000000000";
          uVar4 = 0x119;
        }
      }
      else {
        pcVar3 = "\"10000000\"";
        pcVar5 = "10000000";
        uVar4 = 0x114;
      }
    }
    else {
      pcVar3 = "\"2\"";
      pcVar5 = "2";
      uVar4 = 0x10f;
    }
  }
  else {
    pcVar3 = "\"1\"";
    pcVar5 = "1";
    uVar4 = 0x10a;
  }
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-bignum.cc"
         ,uVar4,pcVar3,"buffer",pcVar5,&local_828);
  abort();
}

Assistant:

TEST(AddBignum) {
  char buffer[kBufferSize];
  Bignum bignum;
  Bignum other;

  AssignHexString(&other, "1");
  AssignHexString(&bignum, "0");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  AssignHexString(&bignum, "1");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000000000", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000000000000000001", buffer);

  AssignHexString(&other, "1000000000000");

  AssignHexString(&bignum, "1");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000001", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000FFFFFFF", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000001000000000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000FFFFFFFFFFFF", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000001000000000000", buffer);

  other.ShiftLeft(64);
  CHECK(other.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000000", buffer);

  bignum.AssignUInt16(0x1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000001", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000FFFFFFF", buffer);

  AssignHexString(&bignum, "10000000000000000000000000000000000000000000");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000010000000000000000000000000000", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFFF");
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000000000FFFFFFFFFFFFFFFFFFFFFFFFFFFF", buffer);

  bignum.AssignUInt16(0x1);
  bignum.ShiftLeft(100);
  bignum.AddBignum(other);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10010000000000000000000000000", buffer);
}